

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O2

bool_t hexIsValid(char *hex)

{
  byte bVar1;
  bool_t bVar2;
  size_t sVar3;
  
  bVar2 = strIsValid(hex);
  if ((bVar2 != 0) && (sVar3 = strLen(hex), (sVar3 & 1) == 0)) {
    do {
      bVar1 = *hex;
      if ((ulong)bVar1 == 0) {
        return 1;
      }
      hex = (char *)((byte *)hex + 1);
    } while (hex_dec_table[bVar1] != 0xff);
  }
  return 0;
}

Assistant:

bool_t hexIsValid(const char* hex)
{
	if (!strIsValid(hex) || strLen(hex) % 2)
		return FALSE;
	for (; *hex; ++hex)
		if (hex_dec_table[(octet)*hex] == 0xFF)
			return FALSE;
	return TRUE;
}